

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-features.h
# Opt level: O2

string * __thiscall
wasm::FeatureSet::toString_abi_cxx11_(string *__return_storage_ptr__,FeatureSet *this)

{
  Feature in_EDX;
  Feature extraout_EDX;
  Feature extraout_EDX_00;
  FeatureSet *this_00;
  string local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  for (this_00 = (FeatureSet *)0x1; ((ulong)this_00 & 0x3fffff) != 0;
      this_00 = (FeatureSet *)(ulong)((uint)this_00 * 2)) {
    if ((this->features & (uint)this_00) != 0) {
      if (__return_storage_ptr__->_M_string_length != 0) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        in_EDX = extraout_EDX;
      }
      toString_abi_cxx11_(&local_50,this_00,in_EDX);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_50);
      in_EDX = extraout_EDX_00;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string toString() const {
    std::string ret;
    uint32_t x = 1;
    while (x & Feature::All) {
      if (features & x) {
        if (!ret.empty()) {
          ret += ", ";
        }
        ret += toString(Feature(x));
      }
      x <<= 1;
    }
    return ret;
  }